

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O0

void FIX::DateTime::getYMD(int jday,int *year,int *month,int *day)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int m;
  int e;
  int d;
  int c;
  int b;
  int a;
  int *day_local;
  int *month_local;
  int *year_local;
  int jday_local;
  
  iVar1 = ((jday + 0x7d2c) * 4 + 3) / 0x23ab1;
  iVar2 = (jday + 0x7d2c) - (iVar1 * 0x23ab1) / 4;
  iVar3 = (iVar2 * 4 + 3) / 0x5b5;
  iVar2 = iVar2 - (iVar3 * 0x5b5) / 4;
  iVar4 = (iVar2 * 5 + 2) / 0x99;
  *day = (iVar2 - (iVar4 * 0x99 + 2) / 5) + 1;
  *month = iVar4 + 3 + (iVar4 / 10) * -0xc;
  *year = iVar1 * 100 + iVar3 + -0x12c0 + iVar4 / 10;
  return;
}

Assistant:

static void getYMD(int jday, int &year, int &month, int &day) {
    int a = jday + 32044;
    int b = (4 * a + 3) / 146097;
    int c = a - int((b * 146097) / 4);
    int d = (4 * c + 3) / 1461;
    int e = c - int((1461 * d) / 4);
    int m = (5 * e + 2) / 153;
    day = e - int((153 * m + 2) / 5) + 1;
    month = m + 3 - 12 * int(m / 10);
    year = b * 100 + d - 4800 + int(m / 10);
  }